

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::ThinDielectricMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,long param_2,long param_3,Float *param_4)

{
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  SampledWavelengths lambda;
  bool bVar1;
  Float *pFVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [56];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar6;
  Float eta;
  undefined1 auVar7 [16];
  undefined1 in_stack_fffffffffffffe48 [64];
  undefined8 in_stack_fffffffffffffe90;
  Float eta_00;
  BxDFHandle *in_stack_fffffffffffffe98;
  UniversalTextureEvaluator *in_stack_fffffffffffffea0;
  Normal3f *in_stack_fffffffffffffea8;
  Normal3f *n;
  Vector3f *wo;
  BSDF *this;
  FloatTextureHandle *in_stack_fffffffffffffec8;
  UniversalTextureEvaluator *in_stack_fffffffffffffed0;
  undefined1 (*__src) [64];
  undefined1 in_stack_fffffffffffffef8 [12];
  ThinDielectricBxDF in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 auVar8 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar9 [40];
  undefined1 in_stack_ffffffffffffff68 [16];
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88 [24];
  undefined1 auVar12 [16];
  undefined1 auStack_60 [40];
  Float local_2c;
  
  eta_00 = (Float)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  auVar7 = in_stack_fffffffffffffe48._0_16_;
  __src = (undefined1 (*) [64])&stack0x00000008;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(param_2 + 8));
  if (bVar1) {
    FloatTextureHandle::FloatTextureHandle(auVar7._8_8_,auVar7._0_8_);
    memcpy(&stack0xffffffffffffff88,__src,0x40);
    auVar3._24_40_ = auStack_60;
    auVar3._0_24_ = in_stack_ffffffffffffff88;
    auVar3 = vmovdqu64_avx512f(auVar3);
    auVar3 = vmovdqu64_avx512f(auVar3);
    auVar7 = auVar3._0_16_;
    ctx._8_8_ = __src;
    ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_1;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)param_2;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)param_2 >> 0x20);
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffef8._0_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffef8._4_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffef8._8_4_;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = in_stack_ffffffffffffff04.eta;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_ffffffffffffff08;
    ctx.dudx = (Float)(int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    ctx.dudy = (Float)(int)in_stack_ffffffffffffff10;
    ctx.dvdx = (Float)(int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    ctx.dvdy = (Float)(int)in_stack_ffffffffffffff18;
    ctx.faceIndex = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    local_2c = UniversalTextureEvaluator::operator()
                         (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,ctx);
  }
  else {
    SpectrumTextureHandle::SpectrumTextureHandle
              ((SpectrumTextureHandle *)auVar7._8_8_,(SpectrumTextureHandle *)auVar7._0_8_);
    auVar3 = vmovdqu64_avx512f(*__src);
    auVar3 = vmovdqu64_avx512f(auVar3);
    auVar9 = auVar3._24_40_;
    eta_00 = (Float)((ulong)*(undefined8 *)(param_3 + 8) >> 0x20);
    in_stack_fffffffffffffe98 = *(BxDFHandle **)(param_3 + 0x10);
    in_stack_fffffffffffffea0 = *(UniversalTextureEvaluator **)(param_3 + 0x18);
    auVar4 = vmovdqu64_avx512f(auVar3);
    auVar3 = vmovdqu64_avx512f(auVar4);
    auVar7 = auVar3._0_16_;
    auVar5 = ZEXT856(auVar4._8_8_);
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_ffffffffffffff68._0_4_;
    ctx_00.dudx = (Float)in_stack_ffffffffffffff68._4_4_;
    ctx_00.dudy = (Float)in_stack_ffffffffffffff68._8_4_;
    ctx_00.dvdx = (Float)in_stack_ffffffffffffff68._12_4_;
    auVar8 = auVar9._0_12_;
    auVar10 = auVar9._12_12_;
    auVar11 = auVar9._24_12_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar8._0_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar8._4_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar8._8_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar10._0_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar10._4_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar10._8_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar11._0_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar11._4_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar11._8_4_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar9._36_4_;
    ctx_00.dvdy = (Float)(int)in_stack_ffffffffffffff78;
    ctx_00.faceIndex = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    auVar12 = in_stack_ffffffffffffff88._8_16_;
    lambda.lambda.values[2] = (float)in_stack_ffffffffffffff88._0_4_;
    lambda.lambda.values[3] = (float)in_stack_ffffffffffffff88._4_4_;
    lambda.pdf.values[0] = (float)auVar12._0_4_;
    lambda.pdf.values[1] = (float)auVar12._4_4_;
    lambda.pdf.values[2] = (float)auVar12._8_4_;
    lambda.pdf.values[3] = (float)auVar12._12_4_;
    lambda.lambda.values[0] = (float)(int)in_stack_ffffffffffffff80;
    lambda.lambda.values[1] = (float)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    SVar6 = UniversalTextureEvaluator::operator()
                      (in_stack_fffffffffffffea0,(SpectrumTextureHandle *)in_stack_fffffffffffffe98,
                       ctx_00,lambda);
    auVar4._0_8_ = SVar6.values.values._0_8_;
    auVar4._8_56_ = auVar5;
    vmovlpd_avx(auVar4._0_16_);
    auVar12._8_8_ = in_XMM1_Qb;
    auVar12._0_8_ = SVar6.values.values._8_8_;
    vmovlpd_avx(auVar12);
    pFVar2 = SampledSpectrum::operator[](auVar7._8_8_,auVar7._4_4_);
    local_2c = *pFVar2;
    SampledWavelengths::TerminateSecondary(auVar7._8_8_);
  }
  ThinDielectricBxDF::ThinDielectricBxDF((ThinDielectricBxDF *)&stack0xffffffffffffff04,local_2c);
  *param_4 = in_stack_ffffffffffffff04.eta;
  n = (Normal3f *)(__src + 1);
  wo = (Vector3f *)(__src[1] + 0xc);
  this = (BSDF *)(__src[1] + 0x18);
  BxDFHandle::TaggedPointer<pbrt::ThinDielectricBxDF>(auVar7._8_8_,auVar7._0_8_);
  BSDF::BSDF(this,wo,n,in_stack_fffffffffffffea8,(Vector3f *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98,eta_00);
  return (BSDF *)param_1;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda,
                              ThinDielectricBxDF *bxdf) const {
        // Compute index of refraction for dielectric material
        Float eta;
        if (etaF)
            eta = texEval(etaF, ctx);
        else {
            eta = texEval(etaS, ctx, lambda)[0];
            lambda.TerminateSecondary();
        }

        // Return BSDF for \use{ThinDielectricMaterial}
        *bxdf = ThinDielectricBxDF(eta);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, eta);
    }